

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

bool __thiscall I2Cdev::writeWords(I2Cdev *this,uint8_t regAddr,uint8_t length,uint16_t *data)

{
  FILE *pFVar1;
  char cVar2;
  int __fd;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  int local_bc;
  int fd;
  int i;
  uint8_t buf [128];
  int8_t count;
  uint16_t *data_local;
  uint8_t length_local;
  uint8_t regAddr_local;
  I2Cdev *this_local;
  
  if (length < 0x40) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    pFVar1 = _stderr;
    if (__fd < 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"Failed to open device: %s\n",pcVar5);
      this_local._7_1_ = false;
    }
    else {
      iVar3 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      pFVar1 = _stderr;
      if (iVar3 < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"Failed to select device: %s\n",pcVar5);
        close(__fd);
        this_local._7_1_ = false;
      }
      else {
        for (local_bc = 0; local_bc < (int)(uint)length; local_bc = local_bc + 1) {
          *(char *)((long)&fd + (long)(local_bc * 2 + 1)) = (char)(data[local_bc] >> 8);
          *(char *)((long)&fd + (long)(local_bc * 2 + 2)) = (char)data[local_bc];
        }
        fd._0_1_ = regAddr;
        sVar6 = write(__fd,&fd,(long)(int)((uint)length * 2 + 1));
        pFVar1 = _stderr;
        cVar2 = (char)sVar6;
        if (cVar2 < '\0') {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar1,"Failed to write device(%d): %s\n",(ulong)(uint)(int)cVar2,pcVar5);
          close(__fd);
          this_local._7_1_ = false;
        }
        else if ((int)cVar2 == (uint)length * 2 + 1) {
          close(__fd);
          this_local._7_1_ = true;
        }
        else {
          fprintf(_stderr,"Short write to device, expected %d, got %d\n",(ulong)(length + 1),
                  (ulong)(uint)(int)cVar2);
          close(__fd);
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"Word write count (%d) > 63\n",(ulong)length);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool I2Cdev::writeWords(uint8_t regAddr, uint8_t length, uint16_t* data) {
    int8_t count = 0;
    uint8_t buf[128];
    int i, fd;

    // Should do potential byteswap and call writeBytes() really, but that
    // messes with the callers buffer

    if (length > 63) {
        fprintf(stderr, "Word write count (%d) > 63\n", length);
        return(FALSE);
    }

    fd = open(this->i2c_path, O_RDWR);
    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(FALSE);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(FALSE);
    }
    buf[0] = regAddr;
    for (i = 0; i < length; i++) {
        buf[i*2+1] = data[i] >> 8;
        buf[i*2+2] = data[i];
    }
    count = write(fd, buf, length*2+1);
    if (count < 0) {
        fprintf(stderr, "Failed to write device(%d): %s\n", count, ::strerror(errno));
        close(fd);
        return(FALSE);
    } else if (count != length*2+1) {
        fprintf(stderr, "Short write to device, expected %d, got %d\n", length+1, count);
        close(fd);
        return(FALSE);
    }
    close(fd);
    return TRUE;
}